

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

void __thiscall
agge::tests::mocks::blender<int,_short>::operator()
          (blender<int,_short> *this,int *pixels,int x,int y,uint length,cover_type_conflict *covers
          )

{
  long lVar1;
  allocator local_79;
  uint local_78 [2];
  LocationInfo local_70;
  string local_48;
  
  local_78[1] = 0;
  local_78[0] = length;
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/mocks.h",
             &local_79);
  ut::LocationInfo::LocationInfo(&local_70,&local_48,0x101);
  ut::are_not_equal<unsigned_int,unsigned_int>(local_78 + 1,local_78,&local_70);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  for (lVar1 = 0; local_78[0] != (uint)lVar1; lVar1 = lVar1 + 1) {
    pixels[lVar1] = (int)covers[lVar1] + (y << 0x18 | (x & 0xffU) << 0x10);
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int x, int y, unsigned int length, const cover_type *covers) const
				{
					assert_not_equal(0u, length);

					int offset = sizeof(cover_type) * 8;
					int mask_x = 0x000000FF << offset;
					int mask_y = 0x0000FF00 << offset;

					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ ((x << offset) & mask_x)
							+ ((y << (offset + 8)) & mask_y));
				}